

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Vector::ContainsMatcher<int,std::allocator<int>,std::allocator<int>>::
describe_abi_cxx11_(string *__return_storage_ptr__,
                   ContainsMatcher<int,std::allocator<int>,std::allocator<int>> *this)

{
  vector<int,_std::allocator<int>_> *in_RDX;
  string local_30;
  
  rangeToString<std::vector<int,std::allocator<int>>>(&local_30,*(Catch **)(this + 0x30),in_RDX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,"Contains: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string describe() const override {
                return "Contains: " + ::Catch::Detail::stringify( m_comparator );
            }